

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O1

string * duckdb_apache::thrift::to_string<std::_Bit_const_iterator>
                   (string *__return_storage_ptr__,_Bit_const_iterator *beg,_Bit_const_iterator *end
                   )

{
  uint uVar1;
  string *psVar2;
  uint uVar3;
  ulong uVar4;
  ulong *puVar5;
  ostringstream o;
  bool local_1d1;
  string *local_1d0;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  puVar5 = (beg->super__Bit_iterator_base)._M_p;
  uVar3 = (beg->super__Bit_iterator_base)._M_offset;
  uVar4 = (ulong)uVar3;
  if ((puVar5 != (end->super__Bit_iterator_base)._M_p) ||
     (uVar3 != (end->super__Bit_iterator_base)._M_offset)) {
    do {
      uVar3 = (uint)uVar4;
      if ((puVar5 != (beg->super__Bit_iterator_base)._M_p) ||
         (uVar3 != (beg->super__Bit_iterator_base)._M_offset)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
      }
      local_1d1 = (*puVar5 >> (uVar4 & 0x3f) & 1) != 0;
      to_string<bool>(&local_1c8,&local_1d1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      uVar1 = uVar3 + 1;
      if (uVar3 == 0x3f) {
        uVar1 = 0;
      }
      uVar4 = (ulong)uVar1;
      puVar5 = puVar5 + (uVar3 == 0x3f);
    } while ((puVar5 != (end->super__Bit_iterator_base)._M_p) ||
            (uVar1 != (end->super__Bit_iterator_base)._M_offset));
  }
  psVar2 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}